

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O1

any __thiscall
peg::Action::TypeAdaptor_csv<std::pair<char32_t,_char32_t>_>::operator()
          (TypeAdaptor_csv<std::pair<char32_t,_char32_t>_> *this,SemanticValues *sv,any *param_2)

{
  _Any_data _Stack_38;
  _Manager_type local_28;
  
  std::function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)>::function
            ((function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)> *)&_Stack_38,
             (function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)> *)sv);
  call<std::pair<char32_t,_char32_t>,_std::function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)>,_nullptr,_peg::SemanticValues_&>
            ((peg *)this,
             (function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)> *)&_Stack_38,
             (SemanticValues *)param_2);
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  return (any)(placeholder *)this;
}

Assistant:

any operator()(SemanticValues& sv, any& /*dt*/) {
            return call<R>(fn_, sv);
        }